

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  ulong uVar1;
  int iVar2;
  const_reference ppLVar3;
  const_reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  Mat *pMVar7;
  int iVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  bool bVar9;
  int top_blob_index_2;
  size_t i_2;
  int ret_5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  int top_blob_index_1;
  size_t i_1;
  int ret_4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs;
  Mat bottom_blob_packed_1;
  int elempack_1;
  Mat bottom_blob_fp32_1;
  Mat bottom_blob_bf16_1;
  int ret_3;
  int bottom_blob_index_1;
  size_t i;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int ret_2;
  Mat top_blob;
  int ret_1;
  Mat *bottom_top_blob;
  Mat bottom_blob_packed;
  int elempack;
  Mat bottom_blob_fp32;
  Mat bottom_blob_bf16;
  Mat bottom_blob;
  int ret;
  int top_blob_index;
  int bottom_blob_index;
  Layer *layer;
  Option *in_stack_00000508;
  undefined4 in_stack_00000510;
  int in_stack_00000514;
  Mat *in_stack_00000518;
  Mat *in_stack_00000520;
  Mat *in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc04;
  size_type in_stack_fffffffffffffc08;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffc10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_01;
  Mat *local_370;
  undefined1 local_361 [29];
  int local_344;
  ulong local_340;
  int local_334;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_330;
  Mat local_328;
  int local_2e4;
  Mat local_2e0;
  Mat local_2a0;
  Mat local_260;
  int local_220;
  int local_21c;
  ulong local_218;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_208;
  int local_1ec;
  Mat local_1e8;
  uint local_1a8;
  int local_1a4;
  Mat *local_1a0;
  Mat local_198;
  int local_154;
  Mat local_150;
  Mat local_110;
  Mat local_d0;
  Mat local_80;
  undefined4 local_3c;
  value_type local_38;
  int local_34;
  value_type opt_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  blob_mats_00 = in_RCX;
  ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)in_ESI);
  iVar8 = (int)in_RCX;
  opt_00 = *ppLVar3;
  if ((opt_00->one_blob_only & 1U) == 0) {
    std::vector<int,_std::allocator<int>_>::size(&opt_00->bottoms);
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x16cd52);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x16cd78);
    for (local_218 = 0; uVar1 = local_218,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->bottoms), uVar1 < sVar6;
        local_218 = local_218 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->bottoms,local_218);
      iVar8 = (int)sVar6;
      local_21c = *pvVar4;
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (in_RDX,(long)local_21c);
      if (pvVar5->dims == 0) {
        std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                  ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                   (long)local_21c);
        iVar8 = (int)blob_mats_00;
        local_220 = forward_layer((Net *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                  (int)((ulong)in_RDX >> 0x20),blob_mats_00,(Option *)opt_00);
        if (local_220 != 0) {
          local_1a8 = 1;
          local_4 = local_220;
          goto LAB_0016d5e8;
        }
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_21c);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_208,local_218);
      ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      if (((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start & 1) != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_21c);
        ncnn::Mat::release(in_stack_fffffffffffffbf0);
        if (((opt_00->support_inplace & 1U) != 0) &&
           (pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (&local_208,local_218), *pvVar5->refcount != 1)) {
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (&local_208,local_218);
          ncnn::Mat::clone(&local_260,(__fn *)pvVar5,(void *)0x0,iVar8,in_R8);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_208,local_218);
          ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
          ncnn::Mat::~Mat((Mat *)0x16cfa8);
        }
      }
      if (((ulong)blob_mats_00[1].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish & 0x100000000) != 0) {
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (&local_208,local_218);
        uVar1 = pvVar5->elemsize;
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (&local_208,local_218);
        if ((uVar1 / (ulong)(long)pvVar5->elempack == 4) &&
           ((opt_00->support_bf16_storage & 1U) != 0)) {
          ncnn::Mat::Mat(&local_2a0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_208,local_218);
          cast_float32_to_bfloat16
                    (in_stack_00000520,in_stack_00000518,
                     (Option *)CONCAT44(in_stack_00000514,in_stack_00000510));
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_208,local_218);
          ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
          ncnn::Mat::~Mat((Mat *)0x16d0b6);
        }
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (&local_208,local_218);
        uVar1 = pvVar5->elemsize;
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (&local_208,local_218);
        if ((uVar1 / (ulong)(long)pvVar5->elempack == 2) &&
           ((opt_00->support_bf16_storage & 1U) == 0)) {
          ncnn::Mat::Mat(&local_2e0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_208,local_218);
          cast_bfloat16_to_float32
                    (in_stack_00000520,in_stack_00000518,
                     (Option *)CONCAT44(in_stack_00000514,in_stack_00000510));
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_208,local_218);
          ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
          ncnn::Mat::~Mat((Mat *)0x16d1b0);
        }
      }
      if (((ulong)blob_mats_00[1].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish & 0x100) != 0) {
        local_2e4 = (opt_00->support_packing & 1) * 3 + 1;
        ncnn::Mat::Mat(&local_328);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_208,local_218);
        convert_packing(in_stack_00000520,in_stack_00000518,in_stack_00000514,in_stack_00000508);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_208,local_218);
        ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        ncnn::Mat::~Mat((Mat *)0x16d281);
      }
    }
    if ((((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start & 1) == 0) ||
       ((opt_00->support_inplace & 1U) == 0)) {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->tops);
      this_01 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_361;
      std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x16d430);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (this_01,sVar6,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x16d456);
      in_stack_fffffffffffffc04 =
           (*opt_00->_vptr_Layer[6])(opt_00,&local_208,local_361 + 1,blob_mats_00);
      if (in_stack_fffffffffffffc04 == 0) {
        local_370 = (Mat *)0x0;
        while (this_00 = local_370,
              pMVar7 = (Mat *)std::vector<int,_std::allocator<int>_>::size(&opt_00->tops),
              this_00 < pMVar7) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&opt_00->tops,(size_type)local_370);
          iVar8 = *pvVar4;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(local_361 + 1),
                              (size_type)local_370);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)iVar8);
          ncnn::Mat::operator=(this_00,pvVar5);
          local_370 = (Mat *)((long)&local_370->data + 1);
        }
        local_1a8 = 0;
      }
      else {
        local_1a8 = 1;
        local_4 = in_stack_fffffffffffffc04;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      if (local_1a8 == 0) goto LAB_0016d5dd;
    }
    else {
      local_330 = &local_208;
      local_334 = (*opt_00->_vptr_Layer[8])(opt_00,local_330,blob_mats_00);
      if (local_334 == 0) {
        for (local_340 = 0; uVar1 = local_340,
            sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->tops), uVar1 < sVar6;
            local_340 = local_340 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->tops,local_340);
          local_344 = *pvVar4;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_330,local_340);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_344);
          ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        }
LAB_0016d5dd:
        local_1a8 = 0;
      }
      else {
        local_1a8 = 1;
        local_4 = local_334;
      }
    }
LAB_0016d5e8:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    goto joined_r0x0016d5fe;
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->bottoms,0);
  local_34 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->tops,0);
  local_38 = *pvVar4;
  pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
  if (pvVar5->dims == 0) {
    std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),(long)local_34);
    iVar8 = (int)blob_mats_00;
    iVar2 = forward_layer((Net *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                          (int)((ulong)in_RDX >> 0x20),blob_mats_00,(Option *)opt_00);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_3c = 0;
  }
  pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
  ncnn::Mat::Mat(&local_80,pvVar5);
  if (((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start & 1) != 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
    ncnn::Mat::release(in_stack_fffffffffffffbf0);
    if (((opt_00->support_inplace & 1U) != 0) && (*local_80.refcount != 1)) {
      ncnn::Mat::clone(&local_d0,(__fn *)&local_80,(void *)0x0,iVar8,in_R8);
      ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      ncnn::Mat::~Mat((Mat *)0x16c8e1);
    }
  }
  if (((ulong)blob_mats_00[1].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish & 0x100000000) != 0) {
    if ((local_80.elemsize / (ulong)(long)local_80.elempack == 4) &&
       ((opt_00->support_bf16_storage & 1U) != 0)) {
      ncnn::Mat::Mat(&local_110);
      cast_float32_to_bfloat16
                (in_stack_00000520,in_stack_00000518,
                 (Option *)CONCAT44(in_stack_00000514,in_stack_00000510));
      ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      ncnn::Mat::~Mat((Mat *)0x16c9b5);
    }
    if ((local_80.elemsize / (ulong)(long)local_80.elempack == 2) &&
       ((opt_00->support_bf16_storage & 1U) == 0)) {
      ncnn::Mat::Mat(&local_150);
      cast_bfloat16_to_float32
                (in_stack_00000520,in_stack_00000518,
                 (Option *)CONCAT44(in_stack_00000514,in_stack_00000510));
      ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      ncnn::Mat::~Mat((Mat *)0x16ca5c);
    }
  }
  if (((ulong)blob_mats_00[1].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish & 0x100) != 0) {
    local_154 = (opt_00->support_packing & 1) * 3 + 1;
    ncnn::Mat::Mat(&local_198);
    convert_packing(in_stack_00000520,in_stack_00000518,in_stack_00000514,in_stack_00000508);
    ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    ncnn::Mat::~Mat((Mat *)0x16cb0d);
  }
  if ((((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start & 1) == 0) || ((opt_00->support_inplace & 1U) == 0))
  {
    ncnn::Mat::Mat(&local_1e8);
    local_1ec = (*opt_00->_vptr_Layer[7])(opt_00,&local_80,&local_1e8,blob_mats_00);
    bVar9 = local_1ec == 0;
    iVar8 = local_1ec;
    if (bVar9) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_38);
      ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      iVar8 = local_4;
    }
    local_4 = iVar8;
    local_1a8 = (uint)!bVar9;
    ncnn::Mat::~Mat((Mat *)0x16ccda);
    if (local_1a8 == 0) goto LAB_0016cce9;
  }
  else {
    local_1a0 = &local_80;
    local_1a4 = (*opt_00->_vptr_Layer[9])(opt_00,local_1a0,blob_mats_00);
    if (local_1a4 == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_38);
      ncnn::Mat::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
LAB_0016cce9:
      local_1a8 = 0;
    }
    else {
      local_1a8 = 1;
      local_4 = local_1a4;
    }
  }
  ncnn::Mat::~Mat((Mat *)0x16cd01);
joined_r0x0016d5fe:
  if (local_1a8 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, const Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     NCNN_LOGE("forward_layer %d %s", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        if (opt.use_bf16_storage)
        {
            if (bottom_blob.elemsize / bottom_blob.elempack == 4u && layer->support_bf16_storage)
            {
                Mat bottom_blob_bf16;
                cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
                bottom_blob = bottom_blob_bf16;
            }
            if (bottom_blob.elemsize / bottom_blob.elempack == 2u && !layer->support_bf16_storage)
            {
                Mat bottom_blob_fp32;
                cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
                bottom_blob = bottom_blob_fp32;
            }
        }

        if (opt.use_packing_layout)
        {
            int elempack = layer->support_packing ? 4 : 1;

            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, elempack, opt);
            bottom_blob = bottom_blob_packed;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }

            if (opt.use_bf16_storage)
            {
                if (bottom_blobs[i].elemsize / bottom_blobs[i].elempack == 4u && layer->support_bf16_storage)
                {
                    Mat bottom_blob_bf16;
                    cast_float32_to_bfloat16(bottom_blobs[i], bottom_blob_bf16, opt);
                    bottom_blobs[i] = bottom_blob_bf16;
                }
                if (bottom_blobs[i].elemsize / bottom_blobs[i].elempack == 2u && !layer->support_bf16_storage)
                {
                    Mat bottom_blob_fp32;
                    cast_bfloat16_to_float32(bottom_blobs[i], bottom_blob_fp32, opt);
                    bottom_blobs[i] = bottom_blob_fp32;
                }
            }

            if (opt.use_packing_layout)
            {
                int elempack = layer->support_packing ? 4 : 1;

                Mat bottom_blob_packed;
                convert_packing(bottom_blobs[i], bottom_blob_packed, elempack, opt);
                bottom_blobs[i] = bottom_blob_packed;
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     NCNN_LOGE("forward_layer %d %s done", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     NCNN_LOGE("[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}